

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20240722::container_internal::
     raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  size_t sVar1;
  ulong uVar2;
  ctrl_t *pcVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar11;
  bool bVar12;
  slot_type *ppFVar13;
  ulong uVar14;
  uint64_t v;
  byte bVar15;
  size_t sVar16;
  ctrl_t cVar17;
  ulong uVar18;
  FindInfo FVar19;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  slot_type *local_58;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  char local_37;
  undefined1 local_36;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe14,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<const google::protobuf::FileDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("!set->fits_in_soo(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe15,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<const google::protobuf::FileDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  sVar1 = common->capacity_;
  if (sVar1 == 0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<const google::protobuf::FileDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  uVar2 = common->size_;
  bVar15 = 0x80;
  if (1 < uVar2 && sVar1 == 1) {
    ppFVar13 = soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                         *)common);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (slot_type)((long)&hash_internal::MixingHashState::kSeed + (long)*ppFVar13);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *ppFVar13 +
                   (SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8));
    bVar15 = (SUB161(auVar6 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB161(auVar6 * ZEXT816(0x9ddfea08eb382d69),0)) & 0x7f;
  }
  local_40 = common->capacity_;
  local_38 = (byte)common->size_ & 1;
  local_37 = sVar1 == 1;
  local_50._0_4_ = *(undefined4 *)&common->heap_or_soo_;
  local_50._4_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 4);
  local_50._8_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 8);
  local_50._12_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 0xc);
  common->capacity_ = new_capacity;
  local_36 = 1 < uVar2 && sVar1 == 1;
  bVar12 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,8ul,true,true,8ul>
                     ((HashSetResizeHelper *)&local_50,common,&local_59,(int)(char)bVar15,8,8);
  if (local_40 == 0) {
    __assert_fail("resize_helper.old_capacity() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe38,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<const google::protobuf::FileDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  if (sVar1 != 1 || 1 < uVar2) {
    local_58 = slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                           *)common);
    if (!bVar12) {
      if (sVar1 == 1) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (long)&hash_internal::MixingHashState::kSeed +
                       CONCAT44(local_50._4_4_,local_50._0_4_);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),0) ^
                       SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),8)) +
                       CONCAT44(local_50._4_4_,local_50._0_4_);
        uVar18 = SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),8) ^
                 SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),0);
        FVar19 = absl::lts_20240722::container_internal::find_first_non_full<void>(common,uVar18);
        uVar14 = FVar19.offset;
        uVar2 = common->capacity_;
        if (uVar2 <= uVar14) {
LAB_0017554d:
          __assert_fail("i < c.capacity()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x70c,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar17 = (ctrl_t)uVar18 & ~kEmpty;
        pcVar3 = (common->heap_or_soo_).heap.control;
        pcVar3[uVar14] = cVar17;
        pcVar3[(ulong)((uint)uVar2 & 0xf) + (uVar14 - 0xf & uVar2)] = cVar17;
        local_58[uVar14] = (slot_type)CONCAT44(local_50._4_4_,local_50._0_4_);
      }
      else {
        if (local_37 == '\x01') {
          __assert_fail("!was_soo_",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7c2,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_40 != 0) {
          lVar11 = CONCAT44(local_50._12_4_,local_50._8_4_);
          sVar16 = 0;
          do {
            if (local_37 == '\x01') {
              __assert_fail("!was_soo_",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7be,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (-1 < *(char *)(CONCAT44(local_50._4_4_,local_50._0_4_) + sVar16)) {
              lVar4 = *(long *)(lVar11 + sVar16 * 8);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = (long)&hash_internal::MixingHashState::kSeed + lVar4;
              auVar10._8_8_ = 0;
              auVar10._0_8_ =
                   (SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),8)) + lVar4;
              uVar18 = SUB168(auVar10 * ZEXT816(0x9ddfea08eb382d69),8) ^
                       SUB168(auVar10 * ZEXT816(0x9ddfea08eb382d69),0);
              FVar19 = absl::lts_20240722::container_internal::find_first_non_full<void>
                                 (common,uVar18);
              uVar14 = FVar19.offset;
              uVar2 = common->capacity_;
              if (uVar2 <= uVar14) goto LAB_0017554d;
              cVar17 = (ctrl_t)uVar18 & ~kEmpty;
              pcVar3 = (common->heap_or_soo_).heap.control;
              pcVar3[uVar14] = cVar17;
              pcVar3[(ulong)((uint)uVar2 & 0xf) + (uVar14 - 0xf & uVar2)] = cVar17;
              local_58[uVar14] = *(slot_type *)(lVar11 + sVar16 * 8);
            }
            sVar16 = sVar16 + 1;
          } while (sVar16 != local_40);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      if (sVar1 != 1) {
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_50,&local_5a,8);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }